

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

void Io_MvFree(Io_MvMan_t *p)

{
  void *__ptr;
  void *pvVar1;
  Vec_Str_t *__ptr_00;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  
  if (p->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(p->pDesign,(Abc_Ntk_t *)0x0);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  pVVar3 = p->vLines;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  if (p->vModels != (Vec_Ptr_t *)0x0) {
    pVVar3 = p->vModels;
    if (0 < pVVar3->nSize) {
      lVar2 = 0;
      do {
        __ptr = pVVar3->pArray[lVar2];
        pvVar1 = *(void **)((long)__ptr + 0x60);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 8);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x10);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x18);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x20);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x28);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x30);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x38);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x40);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x48);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x50);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        pvVar1 = *(void **)((long)__ptr + 0x58);
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar2 = lVar2 + 1;
        pVVar3 = p->vModels;
      } while (lVar2 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    if (pVVar3 != (Vec_Ptr_t *)0x0) {
      free(pVVar3);
    }
  }
  pVVar3 = p->vTokens;
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (void **)0x0;
  }
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vTokens2;
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (void **)0x0;
  }
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    free(pVVar3);
  }
  __ptr_00 = p->vFunc;
  if (__ptr_00->pArray != (char *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (char *)0x0;
  }
  if (__ptr_00 != (Vec_Str_t *)0x0) {
    free(__ptr_00);
  }
  if (p != (Io_MvMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

static void Io_MvFree( Io_MvMan_t * p )
{
    Io_MvMod_t * pMod;
    int i;
    if ( p->pDesign )
        Abc_DesFree( p->pDesign, NULL );
    if ( p->pBuffer )  
        ABC_FREE( p->pBuffer );
    if ( p->vLines )
        Vec_PtrFree( p->vLines  );
    if ( p->vModels )
    {
        Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
            Io_MvModFree( pMod );
        Vec_PtrFree( p->vModels );
    }
    Vec_PtrFree( p->vTokens );
    Vec_PtrFree( p->vTokens2 );
    Vec_StrFree( p->vFunc );
    ABC_FREE( p );
}